

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

ion_bpp_err_t
gather(ion_bpp_handle_t handle,ion_bpp_buffer_t *pbuf,ion_bpp_key_t **pkey,ion_bpp_buffer_t **tmp)

{
  ion_bpp_buffer_t **b;
  ion_bpp_buffer_t **b_00;
  ion_bpp_err_t iVar1;
  int iVar2;
  ion_bpp_key_t *piVar3;
  ushort uVar4;
  long lVar5;
  void *pvVar6;
  ion_bpp_node_t *piVar7;
  
  piVar3 = *pkey;
  if (piVar3 == &pbuf->p->fkey +
                ((ulong)(*(ushort *)pbuf->p >> 1) - 1) * (long)*(int *)((long)handle + 0xbc)) {
    piVar3 = piVar3 + -(long)*(int *)((long)handle + 0xbc);
    *pkey = piVar3;
  }
  iVar1 = readDisk(handle,*(ion_bpp_address_t *)(piVar3 + -8),tmp);
  if (iVar1 == bErrOk) {
    b = tmp + 1;
    iVar1 = readDisk(handle,*(ion_bpp_address_t *)(*pkey + (long)*(int *)((long)handle + 8) + 8),b);
    if (iVar1 == bErrOk) {
      b_00 = tmp + 2;
      iVar1 = readDisk(handle,*(ion_bpp_address_t *)
                               (*pkey + (long)*(int *)((long)handle + 8) + 8 +
                                        (long)*(int *)((long)handle + 0xbc)),b_00);
      if (iVar1 == bErrOk) {
        lVar5 = *(long *)((long)handle + 0x98);
        piVar7 = (*tmp)->p;
        *(ion_bpp_address_t *)(lVar5 + 0x18) = piVar7->childLT;
        memcpy((void *)(lVar5 + 0x20),&piVar7->fkey,
               (ulong)(*(ushort *)piVar7 >> 1) * (long)*(int *)((long)handle + 0xbc));
        lVar5 = lVar5 + (ulong)(*(ushort *)(*tmp)->p >> 1) * (long)*(int *)((long)handle + 0xbc);
        pvVar6 = (void *)(lVar5 + 0x20);
        **(ushort **)((long)handle + 0x98) =
             **(ushort **)((long)handle + 0x98) & 1 | *(ushort *)(*tmp)->p & 0xfffe;
        piVar7 = tmp[1]->p;
        uVar4 = *(ushort *)piVar7;
        iVar2 = *(int *)((long)handle + 0xbc);
        if ((uVar4 & 1) == 0) {
          memcpy(pvVar6,*pkey,(long)iVar2);
          *(ion_bpp_address_t *)(lVar5 + 0x28 + (long)*(int *)((long)handle + 8)) = (*b)->p->childLT
          ;
          **(short **)((long)handle + 0x98) = **(short **)((long)handle + 0x98) + 2;
          iVar2 = *(int *)((long)handle + 0xbc);
          pvVar6 = (void *)((long)pvVar6 + (long)iVar2);
          piVar7 = (*b)->p;
          uVar4 = *(ushort *)piVar7;
        }
        memcpy(pvVar6,&piVar7->fkey,(long)(int)((uint)(uVar4 >> 1) * iVar2));
        pvVar6 = (void *)((ulong)(*(ushort *)(*b)->p >> 1) * (long)*(int *)((long)handle + 0xbc) +
                         (long)pvVar6);
        **(short **)((long)handle + 0x98) =
             **(short **)((long)handle + 0x98) + (*(ushort *)(*b)->p & 0xfffe);
        piVar7 = (*b_00)->p;
        uVar4 = *(ushort *)piVar7;
        iVar2 = *(int *)((long)handle + 0xbc);
        if ((uVar4 & 1) == 0) {
          memcpy(pvVar6,*pkey + iVar2,(long)iVar2);
          *(ion_bpp_address_t *)((long)pvVar6 + (long)*(int *)((long)handle + 8) + 8) =
               (*b_00)->p->childLT;
          **(short **)((long)handle + 0x98) = **(short **)((long)handle + 0x98) + 2;
          iVar2 = *(int *)((long)handle + 0xbc);
          pvVar6 = (void *)((long)pvVar6 + (long)iVar2);
          piVar7 = (*b_00)->p;
          uVar4 = *(ushort *)piVar7;
        }
        memcpy(pvVar6,&piVar7->fkey,(long)(int)((uint)(uVar4 >> 1) * iVar2));
        uVar4 = **(ushort **)((long)handle + 0x98);
        **(ushort **)((long)handle + 0x98) =
             uVar4 & 1 | (uVar4 & 0xfffe) + *(short *)tmp[2]->p & 0xfffe;
        **(ushort **)((long)handle + 0x98) =
             (ushort)*(undefined4 *)*(ushort **)((long)handle + 0x98) & 0xfffe |
             *(ushort *)(*tmp)->p & 1;
        iVar1 = bErrOk;
      }
    }
  }
  return iVar1;
}

Assistant:

static ion_bpp_err_t
gather(
	ion_bpp_handle_t	handle,
	ion_bpp_buffer_t	*pbuf,
	ion_bpp_key_t		**pkey,
	ion_bpp_buffer_t	**tmp
) {
	ion_bpp_h_node_t	*h = handle;
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_buffer_t	*gbuf;
	ion_bpp_key_t		*gkey;

	/*
	 * input:
	 *   pbuf				   parent buffer
	 *   pkey				   pointer to match key in parent
	 * output:
	 *   tmp					buffers to use for scatter
	 *   pkey				   pointer to match key in parent
	 * returns:
	 *   bErrOk				 operation successful
	 * notes:
	 *   Gather 3 buffers to gbuf.  Setup for subsequent scatter by
	 *   doing the following:
	 *	 - setup tmp buffer array for scattered buffers
	 *	 - adjust pkey to point to first key of 3 buffers
	*/

	/* find 3 adjacent buffers */
	if (*pkey == lkey(pbuf)) {
		*pkey -= ks(1);
	}

	if ((rc = readDisk(handle, childLT(*pkey), &tmp[0])) != 0) {
		return rc;
	}

	if ((rc = readDisk(handle, childGE(*pkey), &tmp[1])) != 0) {
		return rc;
	}

	if ((rc = readDisk(handle, childGE(*pkey + ks(1)), &tmp[2])) != 0) {
		return rc;
	}

	/* gather nodes to gbuf */
	gbuf			= &h->gbuf;
	gkey			= fkey(gbuf);

	/* tmp[0] */
	childLT(gkey)	= childLT(fkey(tmp[0]));
	memcpy(gkey, fkey(tmp[0]), ks(ct(tmp[0])));
	gkey			+= ks(ct(tmp[0]));
	ct(gbuf)		= ct(tmp[0]);

	/* tmp[1] */
	if (!leaf(tmp[1])) {
		memcpy(gkey, *pkey, ks(1));
		childGE(gkey)	= childLT(fkey(tmp[1]));
		ct(gbuf)++;
		gkey			+= ks(1);
	}

	memcpy(gkey, fkey(tmp[1]), ks(ct(tmp[1])));
	gkey		+= ks(ct(tmp[1]));
	ct(gbuf)	+= ct(tmp[1]);

	/* tmp[2] */
	if (!leaf(tmp[2])) {
		memcpy(gkey, *pkey + ks(1), ks(1));
		childGE(gkey)	= childLT(fkey(tmp[2]));
		ct(gbuf)++;
		gkey			+= ks(1);
	}

	memcpy(gkey, fkey(tmp[2]), ks(ct(tmp[2])));
	ct(gbuf)	+= ct(tmp[2]);

	leaf(gbuf)	= leaf(tmp[0]);

	return bErrOk;
}